

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.c
# Opt level: O2

int main(void)

{
  int iVar1;
  int *piVar2;
  mmk_verify_params local_1668;
  mmk_verify_params local_1640;
  mmk_verify_params local_1618;
  mmk_verify_params local_15f0;
  mmk_verify_params local_15c8;
  mmk_verify_params local_15a0;
  mmk_verify_params local_1578;
  mmk_verify_params local_1550;
  mmk_verify_params local_1528;
  mmk_verify_params local_1500;
  mmk_verify_params local_14d8;
  mmk_verify_params local_14b0;
  mmk_verify_params local_1488;
  mmk_verify_params local_1460;
  mmk_verify_params local_1438;
  mmk_verify_params local_1410;
  mmk_verify_params local_13e8;
  mmk_verify_params local_13c0;
  mmk_verify_params local_1398;
  mmk_verify_params local_1370;
  mmk_verify_params local_1348;
  mmk_verify_params local_1320;
  mmk_verify_params local_12f8;
  mmk_verify_params local_12d0;
  mmk_verify_params local_12a8;
  mmk_verify_params local_1280;
  mmk_verify_params local_1258;
  mmk_verify_params local_1230;
  mmk_verify_params local_1208;
  mmk_verify_params local_11e0;
  mmk_verify_params local_11b8;
  mmk_verify_params local_1190;
  mmk_verify_params local_1168;
  mmk_verify_params local_1140;
  mmk_verify_params local_1118;
  mmk_verify_params local_10f0;
  mmk_verify_params local_10c8;
  mmk_verify_params local_10a0;
  mmk_verify_params local_1078;
  mmk_verify_params local_1050;
  mmk_verify_params local_1028;
  mmk_verify_params local_1000;
  mmk_verify_params local_fd8;
  mmk_verify_params local_fb0;
  mmk_verify_params local_f88;
  mmk_verify_params local_f60;
  mmk_verify_params local_f38;
  mmk_verify_params local_f10;
  mmk_verify_params local_ee8;
  mmk_verify_params local_ec0;
  mmk_verify_params local_e98;
  mmk_verify_params local_e70;
  mmk_verify_params local_e48;
  mmk_verify_params local_e20;
  mmk_verify_params local_df8;
  mmk_verify_params local_dd0;
  mmk_verify_params local_da8;
  mmk_verify_params local_d80;
  mmk_verify_params local_d58;
  mmk_verify_params local_d30;
  mmk_verify_params local_d08;
  mmk_verify_params local_ce0;
  mmk_verify_params local_cb8;
  mmk_verify_params local_c90;
  mmk_verify_params local_c68;
  mmk_verify_params local_c40;
  mmk_verify_params local_c18;
  mmk_verify_params local_bf0;
  mmk_verify_params local_bc8;
  mmk_verify_params local_ba0;
  mmk_verify_params local_b78;
  mmk_verify_params local_b50;
  mmk_verify_params local_b28;
  mmk_verify_params local_b00;
  mmk_verify_params local_ad8;
  mmk_verify_params local_ab0;
  mmk_verify_params local_a88;
  mmk_verify_params local_a60;
  mmk_verify_params local_a38;
  mmk_verify_params local_a10;
  mmk_verify_params local_9e8;
  mmk_verify_params local_9c0;
  mmk_verify_params local_998;
  mmk_verify_params local_970;
  mmk_verify_params local_948;
  mmk_verify_params local_920;
  mmk_verify_params local_8f8;
  mmk_verify_params local_8d0;
  mmk_verify_params local_8a8;
  mmk_verify_params local_880;
  mmk_verify_params local_858;
  mmk_verify_params local_830;
  mmk_verify_params local_808;
  mmk_verify_params local_7e0;
  mmk_verify_params local_7b8;
  mmk_verify_params local_790;
  mmk_verify_params local_768;
  mmk_verify_params local_740;
  mmk_verify_params local_718;
  mmk_verify_params local_6f0;
  mmk_verify_params local_6c8;
  mmk_verify_params local_6a0;
  mmk_verify_params local_678;
  mmk_verify_params local_650;
  mmk_verify_params local_628;
  mmk_verify_params local_600;
  mmk_verify_params local_5d8;
  mmk_verify_params local_5b0;
  mmk_verify_params local_588;
  mmk_verify_params local_560;
  mmk_verify_params local_538;
  mmk_verify_params local_510;
  mmk_verify_params local_4e8;
  mmk_verify_params local_4c0;
  mmk_verify_params local_498;
  mmk_verify_params local_470;
  mmk_verify_params local_448;
  mmk_verify_params local_420;
  mmk_verify_params local_3f8;
  mmk_verify_params local_3d0;
  mmk_verify_params local_3a8;
  mmk_verify_params local_380;
  mmk_verify_params local_358;
  mmk_verify_params local_330;
  mmk_verify_params local_308;
  mmk_verify_params local_2e0;
  mmk_verify_params local_2b8;
  mmk_verify_params local_290;
  mmk_verify_params local_268;
  mmk_verify_params local_240;
  mmk_verify_params local_218;
  mmk_verify_params local_1f0;
  mmk_verify_params local_1c8;
  mmk_verify_params local_1a0;
  mmk_result local_178;
  mmk_result local_158;
  mmk_result local_138;
  mmk_result local_118;
  mmk_result local_f8;
  mmk_result local_d8;
  mmk_result local_b8;
  mmk_result local_98;
  mmk_result local_78;
  undefined4 local_50;
  undefined4 local_4c;
  undefined4 local_48;
  undefined4 local_44;
  undefined4 local_40;
  undefined4 local_3c;
  undefined4 local_38;
  undefined4 local_34;
  
  mmk_mock_create_internal("fn_vv",mmkuser_fn_vv_mock_stub,(mmk_mock_options)0x1);
  mmk_matcher_init(0);
  local_98.with_va = (mmk_va_info *)0x0;
  local_98.sentinel_ = 0;
  local_98.then_errno = 0;
  local_98.then_return = (void *)0x0;
  local_98.then_call = set_valid;
  mmk_when_init(&local_98);
  fn_vv();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x48);
  mmk_matcher_term();
  mmk_matcher_init(1);
  fn_vv();
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x4a);
  local_1668.times = 0;
  local_1668.matching = (_func_int_size_t *)0x0;
  local_1668.at_least = 0;
  local_1668.at_most = 0;
  local_1668.sentinel_ = 1;
  local_1668.never = 1;
  iVar1 = mmk_verify_times(&local_1668);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x4a
                ,"mmk_verify(fn_vv(), .never = 1)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_vv();
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x4a);
  local_1640.sentinel_ = 1;
  local_1640._4_8_ = 0;
  local_1640._12_8_ = 0;
  local_1640.at_most._4_4_ = 0;
  local_1640.times = 1;
  local_1640.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_1640);
  if (iVar1 != 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x4a
                ,"!mmk_verify(fn_vv(), .times = times + 1)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_vv();
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x4a);
  local_1618.sentinel_ = 1;
  local_1618.never = 0;
  local_1618.at_least = 0;
  local_1618.at_most = 1;
  local_1618.times = 0;
  local_1618.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_1618);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x4a
                ,"mmk_verify(fn_vv(), .at_most = times + 1)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_vv();
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x4a);
  local_15f0.sentinel_ = 1;
  local_15f0.never = 0;
  local_15f0.at_least = 1;
  local_15f0.at_most = 0;
  local_15f0.times = 0;
  local_15f0.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_15f0);
  if (iVar1 != 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x4a
                ,"!mmk_verify(fn_vv(), .at_least = times + 1)");
    mmk_abort();
  }
  fn_vv();
  if (valid == '\0') {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x4c
                ,"valid");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_vv();
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x4d);
  local_15c8.sentinel_ = 1;
  local_15c8._4_8_ = 0;
  local_15c8._12_8_ = 0;
  local_15c8.at_most._4_4_ = 0;
  local_15c8.times = 1;
  local_15c8.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_15c8);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x4d
                ,"mmk_verify(fn_vv(), .times = times)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_vv();
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x4d);
  local_15a0.sentinel_ = 1;
  local_15a0.never = 0;
  local_15a0.at_least = 1;
  local_15a0.at_most = 0;
  local_15a0.times = 0;
  local_15a0.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_15a0);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x4d
                ,"mmk_verify(fn_vv(), .at_least = times)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_vv();
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x4d);
  local_1578.sentinel_ = 1;
  local_1578.never = 0;
  local_1578.at_least = 0;
  local_1578.at_most = 1;
  local_1578.times = 0;
  local_1578.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_1578);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x4d
                ,"mmk_verify(fn_vv(), .at_most = times)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_vv();
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x4d);
  local_1550.sentinel_ = 1;
  local_1550.never = 0;
  local_1550.at_least = 1;
  local_1550.at_most = 1;
  local_1550.times = 0;
  local_1550.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_1550);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x4d
                ,"mmk_verify(fn_vv(), .at_least = times, .at_most = times)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_vv();
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x4d);
  local_1528.times = 0;
  local_1528.matching = (_func_int_size_t *)0x0;
  local_1528.at_least = 0;
  local_1528.at_most = 0;
  local_1528.sentinel_ = 1;
  local_1528.never = 1;
  iVar1 = mmk_verify_times(&local_1528);
  if (iVar1 != 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x4d
                ,"!mmk_verify(fn_vv(), .never = 1)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_vv();
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x4d);
  local_1500.sentinel_ = 1;
  local_1500._4_8_ = 0;
  local_1500._12_8_ = 0;
  local_1500.at_most._4_4_ = 0;
  local_1500.times = 2;
  local_1500.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_1500);
  if (iVar1 != 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x4d
                ,"!mmk_verify(fn_vv(), .times = times + 1)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_vv();
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x4d);
  local_14d8.sentinel_ = 1;
  local_14d8.never = 0;
  local_14d8.at_least = 0;
  local_14d8.at_most = 2;
  local_14d8.times = 0;
  local_14d8.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_14d8);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x4d
                ,"mmk_verify(fn_vv(), .at_most = times + 1)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_vv();
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x4d);
  local_14b0.sentinel_ = 1;
  local_14b0.never = 0;
  local_14b0.at_least = 2;
  local_14b0.at_most = 0;
  local_14b0.times = 0;
  local_14b0.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_14b0);
  if (iVar1 != 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x4d
                ,"!mmk_verify(fn_vv(), .at_least = times + 1)");
    mmk_abort();
  }
  mmk_reset(fn_vv);
  mmk_mock_create_internal("fn_ii",mmkuser_fn_ii_mock_stub,(mmk_mock_options)0x1);
  mmk_matcher_init(0);
  local_178.sentinel_ = 0;
  local_178.then_errno = -0x1010102;
  local_178.then_return = &local_50;
  local_50 = 1;
  local_178.then_call = (_func_void *)0x0;
  local_178.with_va = (mmk_va_info *)0x0;
  mmk_when_init(&local_178);
  fn_ii(1);
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x52);
  mmk_matcher_term();
  mmk_matcher_init(0);
  local_158.sentinel_ = 0;
  local_158.then_errno = -0x1010101;
  local_158.then_return = &local_4c;
  local_4c = 2;
  local_158.then_call = (_func_void *)0x0;
  local_158.with_va = (mmk_va_info *)0x0;
  mmk_when_init(&local_158);
  mmk_matcher_add(MMK_MATCHER_EQ,0);
  fn_ii(2);
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x53);
  mmk_matcher_term();
  mmk_matcher_init(0);
  local_138.sentinel_ = 0;
  local_138.then_errno = -0x1010100;
  local_138.then_return = &local_48;
  local_48 = 3;
  local_138.then_call = (_func_void *)0x0;
  local_138.with_va = (mmk_va_info *)0x0;
  mmk_when_init(&local_138);
  mmk_matcher_add(MMK_MATCHER_GEQ,1);
  fn_ii(3);
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x54);
  mmk_matcher_term();
  mmk_matcher_init(0);
  local_118.sentinel_ = 0;
  local_118.then_errno = -0x10100ff;
  local_118.then_return = &local_44;
  local_44 = 4;
  local_118.then_call = (_func_void *)0x0;
  local_118.with_va = (mmk_va_info *)0x0;
  mmk_when_init(&local_118);
  mmk_matcher_add(MMK_MATCHER_GT,2);
  fn_ii(4);
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x55);
  mmk_matcher_term();
  mmk_matcher_init(0);
  local_f8.sentinel_ = 0;
  local_f8.then_errno = -0x10100fe;
  local_f8.then_return = &local_40;
  local_40 = 5;
  local_f8.then_call = (_func_void *)0x0;
  local_f8.with_va = (mmk_va_info *)0x0;
  mmk_when_init(&local_f8);
  mmk_matcher_add(MMK_MATCHER_LEQ,3);
  fn_ii(0xfffffffffffffffe);
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x56);
  mmk_matcher_term();
  mmk_matcher_init(0);
  local_d8.sentinel_ = 0;
  local_d8.then_errno = -0x10100fd;
  local_d8.then_return = &local_3c;
  local_3c = 6;
  local_d8.then_call = (_func_void *)0x0;
  local_d8.with_va = (mmk_va_info *)0x0;
  mmk_when_init(&local_d8);
  mmk_matcher_add(MMK_MATCHER_LT,4);
  fn_ii(0xfffffffffffffffd);
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x57);
  mmk_matcher_term();
  mmk_matcher_init(0);
  local_b8.sentinel_ = 0;
  local_b8.then_errno = -0x10100fc;
  local_b8.then_return = &local_38;
  local_38 = 7;
  local_b8.then_call = (_func_void *)0x0;
  local_b8.with_va = (mmk_va_info *)0x0;
  mmk_when_init(&local_b8);
  mmk_matcher_add_fn(MMK_MATCHER_THAT,5,int_eq);
  fn_ii(0);
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x58);
  mmk_matcher_term();
  iVar1 = fn_ii(1);
  if (iVar1 == 1) {
    piVar2 = __errno_location();
    if (*piVar2 != -0x1010102) goto LAB_00102af0;
  }
  else {
LAB_00102af0:
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x5a
                ,"fn_ii(1) == 1 && errno == err");
    mmk_abort();
  }
  iVar1 = fn_ii(2);
  if (iVar1 == 2) {
    piVar2 = __errno_location();
    if (*piVar2 != -0x1010101) goto LAB_00102b38;
  }
  else {
LAB_00102b38:
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x5b
                ,"fn_ii(2) == 2 && errno == err + 1");
    mmk_abort();
  }
  iVar1 = fn_ii(3);
  if (iVar1 == 3) {
    piVar2 = __errno_location();
    if (*piVar2 != -0x1010100) goto LAB_00102b8a;
  }
  else {
LAB_00102b8a:
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x5c
                ,"fn_ii(3) == 3 && errno == err + 2");
    mmk_abort();
  }
  iVar1 = fn_ii(4);
  if (iVar1 == 3) {
    piVar2 = __errno_location();
    if (*piVar2 != -0x1010100) goto LAB_00102bd2;
  }
  else {
LAB_00102bd2:
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x5d
                ,"fn_ii(4) == 3 && errno == err + 2");
    mmk_abort();
  }
  iVar1 = fn_ii(5);
  if (iVar1 == 4) {
    piVar2 = __errno_location();
    if (*piVar2 != -0x10100ff) goto LAB_00102c1a;
  }
  else {
LAB_00102c1a:
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x5e
                ,"fn_ii(5) == 4 && errno == err + 3");
    mmk_abort();
  }
  iVar1 = fn_ii(6);
  if (iVar1 == 4) {
    piVar2 = __errno_location();
    if (*piVar2 != -0x10100ff) goto LAB_00102c62;
  }
  else {
LAB_00102c62:
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x5f
                ,"fn_ii(6) == 4 && errno == err + 3");
    mmk_abort();
  }
  iVar1 = fn_ii(0x7fffffff);
  if (iVar1 == 4) {
    piVar2 = __errno_location();
    if (*piVar2 != -0x10100ff) goto LAB_00102cac;
  }
  else {
LAB_00102cac:
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x60
                ,"fn_ii(INT_MAX) == 4 && errno == err + 3");
    mmk_abort();
  }
  iVar1 = fn_ii(0xffffffffffffffff);
  if (iVar1 != 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x61
                ,"fn_ii(-1) == 0");
    mmk_abort();
  }
  iVar1 = fn_ii(0xfffffffffffffffe);
  if (iVar1 == 5) {
    piVar2 = __errno_location();
    if (*piVar2 != -0x10100fe) goto LAB_00102d2e;
  }
  else {
LAB_00102d2e:
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x62
                ,"fn_ii(-2) == 5 && errno == err + 4");
    mmk_abort();
  }
  iVar1 = fn_ii(0xfffffffffffffffd);
  if (iVar1 == 5) {
    piVar2 = __errno_location();
    if (*piVar2 != -0x10100fe) goto LAB_00102d76;
  }
  else {
LAB_00102d76:
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",99,
                "fn_ii(-3) == 5 && errno == err + 4");
    mmk_abort();
  }
  iVar1 = fn_ii(0xfffffffffffffffc);
  if (iVar1 == 6) {
    piVar2 = __errno_location();
    if (*piVar2 != -0x10100fd) goto LAB_00102dbe;
  }
  else {
LAB_00102dbe:
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",100,
                "fn_ii(-4) == 6 && errno == err + 5");
    mmk_abort();
  }
  iVar1 = fn_ii(0xfffffffffffffffb);
  if (iVar1 == 6) {
    piVar2 = __errno_location();
    if (*piVar2 != -0x10100fd) goto LAB_00102e06;
  }
  else {
LAB_00102e06:
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x65
                ,"fn_ii(-5) == 6 && errno == err + 5");
    mmk_abort();
  }
  iVar1 = fn_ii(0x80000000);
  if (iVar1 == 6) {
    piVar2 = __errno_location();
    if (*piVar2 != -0x10100fd) goto LAB_00102e50;
  }
  else {
LAB_00102e50:
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x66
                ,"fn_ii(INT_MIN) == 6 && errno == err + 5");
    mmk_abort();
  }
  expected_int = 1;
  iVar1 = fn_ii(1);
  if (iVar1 == 7) {
    piVar2 = __errno_location();
    if ((*piVar2 == -0x10100fc) && ((int_eq_called & 1) != 0)) goto LAB_00102ed6;
  }
  mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x69,
              "fn_ii(1) == 7 && errno == err + 6 && int_eq_called");
  mmk_abort();
LAB_00102ed6:
  int_eq_called = 0;
  mmk_matcher_init(1);
  mmk_matcher_add(MMK_MATCHER_ANY,6);
  fn_ii(0);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x6c);
  local_1488.sentinel_ = 1;
  local_1488._4_8_ = 0;
  local_1488._12_8_ = 0;
  local_1488.at_most._4_4_ = 0;
  local_1488.times = 0xe;
  local_1488.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_1488);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x6c
                ,
                "mmk_verify(fn_ii((mmk_matcher_add(MMK_MATCHER_ANY, 6), ((int) { 0 }))), .times = times)"
               );
    mmk_abort();
  }
  mmk_matcher_init(1);
  mmk_matcher_add(MMK_MATCHER_ANY,6);
  fn_ii(0);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x6c);
  local_1460.sentinel_ = 1;
  local_1460.never = 0;
  local_1460.at_least = 0xe;
  local_1460.at_most = 0;
  local_1460.times = 0;
  local_1460.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_1460);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x6c
                ,
                "mmk_verify(fn_ii((mmk_matcher_add(MMK_MATCHER_ANY, 6), ((int) { 0 }))), .at_least = times)"
               );
    mmk_abort();
  }
  mmk_matcher_init(1);
  mmk_matcher_add(MMK_MATCHER_ANY,6);
  fn_ii(0);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x6c);
  local_1438.sentinel_ = 1;
  local_1438.never = 0;
  local_1438.at_least = 0;
  local_1438.at_most = 0xe;
  local_1438.times = 0;
  local_1438.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_1438);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x6c
                ,
                "mmk_verify(fn_ii((mmk_matcher_add(MMK_MATCHER_ANY, 6), ((int) { 0 }))), .at_most = times)"
               );
    mmk_abort();
  }
  mmk_matcher_init(1);
  mmk_matcher_add(MMK_MATCHER_ANY,6);
  fn_ii(0);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x6c);
  local_1410.sentinel_ = 1;
  local_1410.never = 0;
  local_1410.at_least = 0xe;
  local_1410.at_most = 0xe;
  local_1410.times = 0;
  local_1410.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_1410);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x6c
                ,
                "mmk_verify(fn_ii((mmk_matcher_add(MMK_MATCHER_ANY, 6), ((int) { 0 }))), .at_least = times, .at_most = times)"
               );
    mmk_abort();
  }
  mmk_matcher_init(1);
  mmk_matcher_add(MMK_MATCHER_ANY,6);
  fn_ii(0);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x6c);
  local_13e8.times = 0;
  local_13e8.matching = (_func_int_size_t *)0x0;
  local_13e8.at_least = 0;
  local_13e8.at_most = 0;
  local_13e8.sentinel_ = 1;
  local_13e8.never = 1;
  iVar1 = mmk_verify_times(&local_13e8);
  if (iVar1 != 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x6c
                ,
                "!mmk_verify(fn_ii((mmk_matcher_add(MMK_MATCHER_ANY, 6), ((int) { 0 }))), .never = 1)"
               );
    mmk_abort();
  }
  mmk_matcher_init(1);
  mmk_matcher_add(MMK_MATCHER_ANY,6);
  fn_ii(0);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x6c);
  local_13c0.sentinel_ = 1;
  local_13c0._4_8_ = 0;
  local_13c0._12_8_ = 0;
  local_13c0.at_most._4_4_ = 0;
  local_13c0.times = 0xd;
  local_13c0.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_13c0);
  if (iVar1 != 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x6c
                ,
                "!mmk_verify(fn_ii((mmk_matcher_add(MMK_MATCHER_ANY, 6), ((int) { 0 }))), .times = times - 1)"
               );
    mmk_abort();
  }
  mmk_matcher_init(1);
  mmk_matcher_add(MMK_MATCHER_ANY,6);
  fn_ii(0);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x6c);
  local_1398.sentinel_ = 1;
  local_1398.never = 0;
  local_1398.at_least = 0xd;
  local_1398.at_most = 0;
  local_1398.times = 0;
  local_1398.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_1398);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x6c
                ,
                "mmk_verify(fn_ii((mmk_matcher_add(MMK_MATCHER_ANY, 6), ((int) { 0 }))), .at_least = times - 1)"
               );
    mmk_abort();
  }
  mmk_matcher_init(1);
  mmk_matcher_add(MMK_MATCHER_ANY,6);
  fn_ii(0);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x6c);
  local_1370.sentinel_ = 1;
  local_1370.never = 0;
  local_1370.at_least = 0;
  local_1370.at_most = 0xd;
  local_1370.times = 0;
  local_1370.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_1370);
  if (iVar1 != 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x6c
                ,
                "!mmk_verify(fn_ii((mmk_matcher_add(MMK_MATCHER_ANY, 6), ((int) { 0 }))), .at_most = times - 1)"
               );
    mmk_abort();
  }
  mmk_matcher_init(1);
  mmk_matcher_add(MMK_MATCHER_ANY,6);
  fn_ii(0);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x6c);
  local_1348.sentinel_ = 1;
  local_1348._4_8_ = 0;
  local_1348._12_8_ = 0;
  local_1348.at_most._4_4_ = 0;
  local_1348.times = 0xf;
  local_1348.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_1348);
  if (iVar1 != 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x6c
                ,
                "!mmk_verify(fn_ii((mmk_matcher_add(MMK_MATCHER_ANY, 6), ((int) { 0 }))), .times = times + 1)"
               );
    mmk_abort();
  }
  mmk_matcher_init(1);
  mmk_matcher_add(MMK_MATCHER_ANY,6);
  fn_ii(0);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x6c);
  local_1320.sentinel_ = 1;
  local_1320.never = 0;
  local_1320.at_least = 0;
  local_1320.at_most = 0xf;
  local_1320.times = 0;
  local_1320.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_1320);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x6c
                ,
                "mmk_verify(fn_ii((mmk_matcher_add(MMK_MATCHER_ANY, 6), ((int) { 0 }))), .at_most = times + 1)"
               );
    mmk_abort();
  }
  mmk_matcher_init(1);
  mmk_matcher_add(MMK_MATCHER_ANY,6);
  fn_ii(0);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x6c);
  local_12f8.sentinel_ = 1;
  local_12f8.never = 0;
  local_12f8.at_least = 0xf;
  local_12f8.at_most = 0;
  local_12f8.times = 0;
  local_12f8.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_12f8);
  if (iVar1 != 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x6c
                ,
                "!mmk_verify(fn_ii((mmk_matcher_add(MMK_MATCHER_ANY, 6), ((int) { 0 }))), .at_least = times + 1)"
               );
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(1);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x6d);
  local_12d0.sentinel_ = 1;
  local_12d0._4_8_ = 0;
  local_12d0._12_8_ = 0;
  local_12d0.at_most._4_4_ = 0;
  local_12d0.times = 2;
  local_12d0.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_12d0);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x6d
                ,"mmk_verify(fn_ii(1), .times = times)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(1);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x6d);
  local_12a8.sentinel_ = 1;
  local_12a8.never = 0;
  local_12a8.at_least = 2;
  local_12a8.at_most = 0;
  local_12a8.times = 0;
  local_12a8.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_12a8);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x6d
                ,"mmk_verify(fn_ii(1), .at_least = times)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(1);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x6d);
  local_1280.sentinel_ = 1;
  local_1280.never = 0;
  local_1280.at_least = 0;
  local_1280.at_most = 2;
  local_1280.times = 0;
  local_1280.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_1280);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x6d
                ,"mmk_verify(fn_ii(1), .at_most = times)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(1);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x6d);
  local_1258.sentinel_ = 1;
  local_1258.never = 0;
  local_1258.at_least = 2;
  local_1258.at_most = 2;
  local_1258.times = 0;
  local_1258.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_1258);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x6d
                ,"mmk_verify(fn_ii(1), .at_least = times, .at_most = times)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(1);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x6d);
  local_1230.times = 0;
  local_1230.matching = (_func_int_size_t *)0x0;
  local_1230.at_least = 0;
  local_1230.at_most = 0;
  local_1230.sentinel_ = 1;
  local_1230.never = 1;
  iVar1 = mmk_verify_times(&local_1230);
  if (iVar1 != 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x6d
                ,"!mmk_verify(fn_ii(1), .never = 1)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(1);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x6d);
  local_1208.sentinel_ = 1;
  local_1208._4_8_ = 0;
  local_1208._12_8_ = 0;
  local_1208.at_most._4_4_ = 0;
  local_1208.times = 1;
  local_1208.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_1208);
  if (iVar1 != 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x6d
                ,"!mmk_verify(fn_ii(1), .times = times - 1)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(1);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x6d);
  local_11e0.sentinel_ = 1;
  local_11e0.never = 0;
  local_11e0.at_least = 1;
  local_11e0.at_most = 0;
  local_11e0.times = 0;
  local_11e0.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_11e0);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x6d
                ,"mmk_verify(fn_ii(1), .at_least = times - 1)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(1);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x6d);
  local_11b8.sentinel_ = 1;
  local_11b8.never = 0;
  local_11b8.at_least = 0;
  local_11b8.at_most = 1;
  local_11b8.times = 0;
  local_11b8.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_11b8);
  if (iVar1 != 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x6d
                ,"!mmk_verify(fn_ii(1), .at_most = times - 1)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(1);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x6d);
  local_1190.sentinel_ = 1;
  local_1190._4_8_ = 0;
  local_1190._12_8_ = 0;
  local_1190.at_most._4_4_ = 0;
  local_1190.times = 3;
  local_1190.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_1190);
  if (iVar1 != 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x6d
                ,"!mmk_verify(fn_ii(1), .times = times + 1)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(1);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x6d);
  local_1168.sentinel_ = 1;
  local_1168.never = 0;
  local_1168.at_least = 0;
  local_1168.at_most = 3;
  local_1168.times = 0;
  local_1168.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_1168);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x6d
                ,"mmk_verify(fn_ii(1), .at_most = times + 1)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(1);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x6d);
  local_1140.sentinel_ = 1;
  local_1140.never = 0;
  local_1140.at_least = 3;
  local_1140.at_most = 0;
  local_1140.times = 0;
  local_1140.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_1140);
  if (iVar1 != 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x6d
                ,"!mmk_verify(fn_ii(1), .at_least = times + 1)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(2);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x6e);
  local_1118.sentinel_ = 1;
  local_1118._4_8_ = 0;
  local_1118._12_8_ = 0;
  local_1118.at_most._4_4_ = 0;
  local_1118.times = 1;
  local_1118.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_1118);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x6e
                ,"mmk_verify(fn_ii(2), .times = times)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(2);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x6e);
  local_10f0.sentinel_ = 1;
  local_10f0.never = 0;
  local_10f0.at_least = 1;
  local_10f0.at_most = 0;
  local_10f0.times = 0;
  local_10f0.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_10f0);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x6e
                ,"mmk_verify(fn_ii(2), .at_least = times)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(2);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x6e);
  local_10c8.sentinel_ = 1;
  local_10c8.never = 0;
  local_10c8.at_least = 0;
  local_10c8.at_most = 1;
  local_10c8.times = 0;
  local_10c8.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_10c8);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x6e
                ,"mmk_verify(fn_ii(2), .at_most = times)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(2);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x6e);
  local_10a0.sentinel_ = 1;
  local_10a0.never = 0;
  local_10a0.at_least = 1;
  local_10a0.at_most = 1;
  local_10a0.times = 0;
  local_10a0.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_10a0);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x6e
                ,"mmk_verify(fn_ii(2), .at_least = times, .at_most = times)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(2);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x6e);
  local_1078.times = 0;
  local_1078.matching = (_func_int_size_t *)0x0;
  local_1078.at_least = 0;
  local_1078.at_most = 0;
  local_1078.sentinel_ = 1;
  local_1078.never = 1;
  iVar1 = mmk_verify_times(&local_1078);
  if (iVar1 != 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x6e
                ,"!mmk_verify(fn_ii(2), .never = 1)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(2);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x6e);
  local_1050.sentinel_ = 1;
  local_1050._4_8_ = 0;
  local_1050._12_8_ = 0;
  local_1050.at_most._4_4_ = 0;
  local_1050.times = 2;
  local_1050.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_1050);
  if (iVar1 != 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x6e
                ,"!mmk_verify(fn_ii(2), .times = times + 1)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(2);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x6e);
  local_1028.sentinel_ = 1;
  local_1028.never = 0;
  local_1028.at_least = 0;
  local_1028.at_most = 2;
  local_1028.times = 0;
  local_1028.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_1028);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x6e
                ,"mmk_verify(fn_ii(2), .at_most = times + 1)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(2);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x6e);
  local_1000.sentinel_ = 1;
  local_1000.never = 0;
  local_1000.at_least = 2;
  local_1000.at_most = 0;
  local_1000.times = 0;
  local_1000.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_1000);
  if (iVar1 != 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x6e
                ,"!mmk_verify(fn_ii(2), .at_least = times + 1)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(3);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x6f);
  local_fd8.sentinel_ = 1;
  local_fd8._4_8_ = 0;
  local_fd8._12_8_ = 0;
  local_fd8.at_most._4_4_ = 0;
  local_fd8.times = 1;
  local_fd8.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_fd8);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x6f
                ,"mmk_verify(fn_ii(3), .times = times)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(3);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x6f);
  local_fb0.sentinel_ = 1;
  local_fb0.never = 0;
  local_fb0.at_least = 1;
  local_fb0.at_most = 0;
  local_fb0.times = 0;
  local_fb0.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_fb0);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x6f
                ,"mmk_verify(fn_ii(3), .at_least = times)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(3);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x6f);
  local_f88.sentinel_ = 1;
  local_f88.never = 0;
  local_f88.at_least = 0;
  local_f88.at_most = 1;
  local_f88.times = 0;
  local_f88.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_f88);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x6f
                ,"mmk_verify(fn_ii(3), .at_most = times)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(3);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x6f);
  local_f60.sentinel_ = 1;
  local_f60.never = 0;
  local_f60.at_least = 1;
  local_f60.at_most = 1;
  local_f60.times = 0;
  local_f60.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_f60);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x6f
                ,"mmk_verify(fn_ii(3), .at_least = times, .at_most = times)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(3);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x6f);
  local_f38.times = 0;
  local_f38.matching = (_func_int_size_t *)0x0;
  local_f38.at_least = 0;
  local_f38.at_most = 0;
  local_f38.sentinel_ = 1;
  local_f38.never = 1;
  iVar1 = mmk_verify_times(&local_f38);
  if (iVar1 != 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x6f
                ,"!mmk_verify(fn_ii(3), .never = 1)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(3);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x6f);
  local_f10.sentinel_ = 1;
  local_f10._4_8_ = 0;
  local_f10._12_8_ = 0;
  local_f10.at_most._4_4_ = 0;
  local_f10.times = 2;
  local_f10.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_f10);
  if (iVar1 != 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x6f
                ,"!mmk_verify(fn_ii(3), .times = times + 1)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(3);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x6f);
  local_ee8.sentinel_ = 1;
  local_ee8.never = 0;
  local_ee8.at_least = 0;
  local_ee8.at_most = 2;
  local_ee8.times = 0;
  local_ee8.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_ee8);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x6f
                ,"mmk_verify(fn_ii(3), .at_most = times + 1)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(3);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x6f);
  local_ec0.sentinel_ = 1;
  local_ec0.never = 0;
  local_ec0.at_least = 2;
  local_ec0.at_most = 0;
  local_ec0.times = 0;
  local_ec0.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_ec0);
  if (iVar1 != 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x6f
                ,"!mmk_verify(fn_ii(3), .at_least = times + 1)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(4);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x70);
  local_e98.sentinel_ = 1;
  local_e98._4_8_ = 0;
  local_e98._12_8_ = 0;
  local_e98.at_most._4_4_ = 0;
  local_e98.times = 1;
  local_e98.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_e98);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x70
                ,"mmk_verify(fn_ii(4), .times = times)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(4);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x70);
  local_e70.sentinel_ = 1;
  local_e70.never = 0;
  local_e70.at_least = 1;
  local_e70.at_most = 0;
  local_e70.times = 0;
  local_e70.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_e70);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x70
                ,"mmk_verify(fn_ii(4), .at_least = times)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(4);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x70);
  local_e48.sentinel_ = 1;
  local_e48.never = 0;
  local_e48.at_least = 0;
  local_e48.at_most = 1;
  local_e48.times = 0;
  local_e48.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_e48);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x70
                ,"mmk_verify(fn_ii(4), .at_most = times)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(4);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x70);
  local_e20.sentinel_ = 1;
  local_e20.never = 0;
  local_e20.at_least = 1;
  local_e20.at_most = 1;
  local_e20.times = 0;
  local_e20.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_e20);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x70
                ,"mmk_verify(fn_ii(4), .at_least = times, .at_most = times)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(4);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x70);
  local_df8.times = 0;
  local_df8.matching = (_func_int_size_t *)0x0;
  local_df8.at_least = 0;
  local_df8.at_most = 0;
  local_df8.sentinel_ = 1;
  local_df8.never = 1;
  iVar1 = mmk_verify_times(&local_df8);
  if (iVar1 != 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x70
                ,"!mmk_verify(fn_ii(4), .never = 1)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(4);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x70);
  local_dd0.sentinel_ = 1;
  local_dd0._4_8_ = 0;
  local_dd0._12_8_ = 0;
  local_dd0.at_most._4_4_ = 0;
  local_dd0.times = 2;
  local_dd0.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_dd0);
  if (iVar1 != 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x70
                ,"!mmk_verify(fn_ii(4), .times = times + 1)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(4);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x70);
  local_da8.sentinel_ = 1;
  local_da8.never = 0;
  local_da8.at_least = 0;
  local_da8.at_most = 2;
  local_da8.times = 0;
  local_da8.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_da8);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x70
                ,"mmk_verify(fn_ii(4), .at_most = times + 1)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(4);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x70);
  local_d80.sentinel_ = 1;
  local_d80.never = 0;
  local_d80.at_least = 2;
  local_d80.at_most = 0;
  local_d80.times = 0;
  local_d80.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_d80);
  if (iVar1 != 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x70
                ,"!mmk_verify(fn_ii(4), .at_least = times + 1)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(5);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x71);
  local_d58.sentinel_ = 1;
  local_d58._4_8_ = 0;
  local_d58._12_8_ = 0;
  local_d58.at_most._4_4_ = 0;
  local_d58.times = 1;
  local_d58.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_d58);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x71
                ,"mmk_verify(fn_ii(5), .times = times)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(5);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x71);
  local_d30.sentinel_ = 1;
  local_d30.never = 0;
  local_d30.at_least = 1;
  local_d30.at_most = 0;
  local_d30.times = 0;
  local_d30.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_d30);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x71
                ,"mmk_verify(fn_ii(5), .at_least = times)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(5);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x71);
  local_d08.sentinel_ = 1;
  local_d08.never = 0;
  local_d08.at_least = 0;
  local_d08.at_most = 1;
  local_d08.times = 0;
  local_d08.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_d08);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x71
                ,"mmk_verify(fn_ii(5), .at_most = times)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(5);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x71);
  local_ce0.sentinel_ = 1;
  local_ce0.never = 0;
  local_ce0.at_least = 1;
  local_ce0.at_most = 1;
  local_ce0.times = 0;
  local_ce0.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_ce0);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x71
                ,"mmk_verify(fn_ii(5), .at_least = times, .at_most = times)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(5);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x71);
  local_cb8.times = 0;
  local_cb8.matching = (_func_int_size_t *)0x0;
  local_cb8.at_least = 0;
  local_cb8.at_most = 0;
  local_cb8.sentinel_ = 1;
  local_cb8.never = 1;
  iVar1 = mmk_verify_times(&local_cb8);
  if (iVar1 != 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x71
                ,"!mmk_verify(fn_ii(5), .never = 1)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(5);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x71);
  local_c90.sentinel_ = 1;
  local_c90._4_8_ = 0;
  local_c90._12_8_ = 0;
  local_c90.at_most._4_4_ = 0;
  local_c90.times = 2;
  local_c90.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_c90);
  if (iVar1 != 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x71
                ,"!mmk_verify(fn_ii(5), .times = times + 1)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(5);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x71);
  local_c68.sentinel_ = 1;
  local_c68.never = 0;
  local_c68.at_least = 0;
  local_c68.at_most = 2;
  local_c68.times = 0;
  local_c68.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_c68);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x71
                ,"mmk_verify(fn_ii(5), .at_most = times + 1)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(5);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x71);
  local_c40.sentinel_ = 1;
  local_c40.never = 0;
  local_c40.at_least = 2;
  local_c40.at_most = 0;
  local_c40.times = 0;
  local_c40.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_c40);
  if (iVar1 != 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x71
                ,"!mmk_verify(fn_ii(5), .at_least = times + 1)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(6);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x72);
  local_c18.sentinel_ = 1;
  local_c18._4_8_ = 0;
  local_c18._12_8_ = 0;
  local_c18.at_most._4_4_ = 0;
  local_c18.times = 1;
  local_c18.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_c18);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x72
                ,"mmk_verify(fn_ii(6), .times = times)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(6);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x72);
  local_bf0.sentinel_ = 1;
  local_bf0.never = 0;
  local_bf0.at_least = 1;
  local_bf0.at_most = 0;
  local_bf0.times = 0;
  local_bf0.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_bf0);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x72
                ,"mmk_verify(fn_ii(6), .at_least = times)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(6);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x72);
  local_bc8.sentinel_ = 1;
  local_bc8.never = 0;
  local_bc8.at_least = 0;
  local_bc8.at_most = 1;
  local_bc8.times = 0;
  local_bc8.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_bc8);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x72
                ,"mmk_verify(fn_ii(6), .at_most = times)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(6);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x72);
  local_ba0.sentinel_ = 1;
  local_ba0.never = 0;
  local_ba0.at_least = 1;
  local_ba0.at_most = 1;
  local_ba0.times = 0;
  local_ba0.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_ba0);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x72
                ,"mmk_verify(fn_ii(6), .at_least = times, .at_most = times)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(6);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x72);
  local_b78.times = 0;
  local_b78.matching = (_func_int_size_t *)0x0;
  local_b78.at_least = 0;
  local_b78.at_most = 0;
  local_b78.sentinel_ = 1;
  local_b78.never = 1;
  iVar1 = mmk_verify_times(&local_b78);
  if (iVar1 != 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x72
                ,"!mmk_verify(fn_ii(6), .never = 1)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(6);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x72);
  local_b50.sentinel_ = 1;
  local_b50._4_8_ = 0;
  local_b50._12_8_ = 0;
  local_b50.at_most._4_4_ = 0;
  local_b50.times = 2;
  local_b50.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_b50);
  if (iVar1 != 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x72
                ,"!mmk_verify(fn_ii(6), .times = times + 1)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(6);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x72);
  local_b28.sentinel_ = 1;
  local_b28.never = 0;
  local_b28.at_least = 0;
  local_b28.at_most = 2;
  local_b28.times = 0;
  local_b28.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_b28);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x72
                ,"mmk_verify(fn_ii(6), .at_most = times + 1)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(6);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x72);
  local_b00.sentinel_ = 1;
  local_b00.never = 0;
  local_b00.at_least = 2;
  local_b00.at_most = 0;
  local_b00.times = 0;
  local_b00.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_b00);
  if (iVar1 != 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x72
                ,"!mmk_verify(fn_ii(6), .at_least = times + 1)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(0x7fffffff);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x73);
  local_ad8.sentinel_ = 1;
  local_ad8._4_8_ = 0;
  local_ad8._12_8_ = 0;
  local_ad8.at_most._4_4_ = 0;
  local_ad8.times = 1;
  local_ad8.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_ad8);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x73
                ,"mmk_verify(fn_ii(2147483647), .times = times)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(0x7fffffff);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x73);
  local_ab0.sentinel_ = 1;
  local_ab0.never = 0;
  local_ab0.at_least = 1;
  local_ab0.at_most = 0;
  local_ab0.times = 0;
  local_ab0.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_ab0);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x73
                ,"mmk_verify(fn_ii(2147483647), .at_least = times)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(0x7fffffff);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x73);
  local_a88.sentinel_ = 1;
  local_a88.never = 0;
  local_a88.at_least = 0;
  local_a88.at_most = 1;
  local_a88.times = 0;
  local_a88.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_a88);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x73
                ,"mmk_verify(fn_ii(2147483647), .at_most = times)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(0x7fffffff);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x73);
  local_a60.sentinel_ = 1;
  local_a60.never = 0;
  local_a60.at_least = 1;
  local_a60.at_most = 1;
  local_a60.times = 0;
  local_a60.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_a60);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x73
                ,"mmk_verify(fn_ii(2147483647), .at_least = times, .at_most = times)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(0x7fffffff);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x73);
  local_a38.times = 0;
  local_a38.matching = (_func_int_size_t *)0x0;
  local_a38.at_least = 0;
  local_a38.at_most = 0;
  local_a38.sentinel_ = 1;
  local_a38.never = 1;
  iVar1 = mmk_verify_times(&local_a38);
  if (iVar1 != 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x73
                ,"!mmk_verify(fn_ii(2147483647), .never = 1)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(0x7fffffff);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x73);
  local_a10.sentinel_ = 1;
  local_a10._4_8_ = 0;
  local_a10._12_8_ = 0;
  local_a10.at_most._4_4_ = 0;
  local_a10.times = 2;
  local_a10.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_a10);
  if (iVar1 != 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x73
                ,"!mmk_verify(fn_ii(2147483647), .times = times + 1)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(0x7fffffff);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x73);
  local_9e8.sentinel_ = 1;
  local_9e8.never = 0;
  local_9e8.at_least = 0;
  local_9e8.at_most = 2;
  local_9e8.times = 0;
  local_9e8.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_9e8);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x73
                ,"mmk_verify(fn_ii(2147483647), .at_most = times + 1)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(0x7fffffff);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x73);
  local_9c0.sentinel_ = 1;
  local_9c0.never = 0;
  local_9c0.at_least = 2;
  local_9c0.at_most = 0;
  local_9c0.times = 0;
  local_9c0.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_9c0);
  if (iVar1 != 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x73
                ,"!mmk_verify(fn_ii(2147483647), .at_least = times + 1)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(0xffffffffffffffff);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x74);
  local_998.sentinel_ = 1;
  local_998._4_8_ = 0;
  local_998._12_8_ = 0;
  local_998.at_most._4_4_ = 0;
  local_998.times = 1;
  local_998.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_998);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x74
                ,"mmk_verify(fn_ii(-1), .times = times)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(0xffffffffffffffff);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x74);
  local_970.sentinel_ = 1;
  local_970.never = 0;
  local_970.at_least = 1;
  local_970.at_most = 0;
  local_970.times = 0;
  local_970.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_970);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x74
                ,"mmk_verify(fn_ii(-1), .at_least = times)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(0xffffffffffffffff);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x74);
  local_948.sentinel_ = 1;
  local_948.never = 0;
  local_948.at_least = 0;
  local_948.at_most = 1;
  local_948.times = 0;
  local_948.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_948);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x74
                ,"mmk_verify(fn_ii(-1), .at_most = times)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(0xffffffffffffffff);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x74);
  local_920.sentinel_ = 1;
  local_920.never = 0;
  local_920.at_least = 1;
  local_920.at_most = 1;
  local_920.times = 0;
  local_920.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_920);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x74
                ,"mmk_verify(fn_ii(-1), .at_least = times, .at_most = times)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(0xffffffffffffffff);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x74);
  local_8f8.times = 0;
  local_8f8.matching = (_func_int_size_t *)0x0;
  local_8f8.at_least = 0;
  local_8f8.at_most = 0;
  local_8f8.sentinel_ = 1;
  local_8f8.never = 1;
  iVar1 = mmk_verify_times(&local_8f8);
  if (iVar1 != 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x74
                ,"!mmk_verify(fn_ii(-1), .never = 1)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(0xffffffffffffffff);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x74);
  local_8d0.sentinel_ = 1;
  local_8d0._4_8_ = 0;
  local_8d0._12_8_ = 0;
  local_8d0.at_most._4_4_ = 0;
  local_8d0.times = 2;
  local_8d0.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_8d0);
  if (iVar1 != 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x74
                ,"!mmk_verify(fn_ii(-1), .times = times + 1)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(0xffffffffffffffff);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x74);
  local_8a8.sentinel_ = 1;
  local_8a8.never = 0;
  local_8a8.at_least = 0;
  local_8a8.at_most = 2;
  local_8a8.times = 0;
  local_8a8.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_8a8);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x74
                ,"mmk_verify(fn_ii(-1), .at_most = times + 1)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(0xffffffffffffffff);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x74);
  local_880.sentinel_ = 1;
  local_880.never = 0;
  local_880.at_least = 2;
  local_880.at_most = 0;
  local_880.times = 0;
  local_880.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_880);
  if (iVar1 != 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x74
                ,"!mmk_verify(fn_ii(-1), .at_least = times + 1)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(0xfffffffffffffffe);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x75);
  local_858.sentinel_ = 1;
  local_858._4_8_ = 0;
  local_858._12_8_ = 0;
  local_858.at_most._4_4_ = 0;
  local_858.times = 1;
  local_858.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_858);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x75
                ,"mmk_verify(fn_ii(-2), .times = times)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(0xfffffffffffffffe);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x75);
  local_830.sentinel_ = 1;
  local_830.never = 0;
  local_830.at_least = 1;
  local_830.at_most = 0;
  local_830.times = 0;
  local_830.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_830);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x75
                ,"mmk_verify(fn_ii(-2), .at_least = times)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(0xfffffffffffffffe);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x75);
  local_808.sentinel_ = 1;
  local_808.never = 0;
  local_808.at_least = 0;
  local_808.at_most = 1;
  local_808.times = 0;
  local_808.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_808);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x75
                ,"mmk_verify(fn_ii(-2), .at_most = times)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(0xfffffffffffffffe);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x75);
  local_7e0.sentinel_ = 1;
  local_7e0.never = 0;
  local_7e0.at_least = 1;
  local_7e0.at_most = 1;
  local_7e0.times = 0;
  local_7e0.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_7e0);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x75
                ,"mmk_verify(fn_ii(-2), .at_least = times, .at_most = times)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(0xfffffffffffffffe);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x75);
  local_7b8.times = 0;
  local_7b8.matching = (_func_int_size_t *)0x0;
  local_7b8.at_least = 0;
  local_7b8.at_most = 0;
  local_7b8.sentinel_ = 1;
  local_7b8.never = 1;
  iVar1 = mmk_verify_times(&local_7b8);
  if (iVar1 != 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x75
                ,"!mmk_verify(fn_ii(-2), .never = 1)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(0xfffffffffffffffe);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x75);
  local_790.sentinel_ = 1;
  local_790._4_8_ = 0;
  local_790._12_8_ = 0;
  local_790.at_most._4_4_ = 0;
  local_790.times = 2;
  local_790.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_790);
  if (iVar1 != 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x75
                ,"!mmk_verify(fn_ii(-2), .times = times + 1)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(0xfffffffffffffffe);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x75);
  local_768.sentinel_ = 1;
  local_768.never = 0;
  local_768.at_least = 0;
  local_768.at_most = 2;
  local_768.times = 0;
  local_768.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_768);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x75
                ,"mmk_verify(fn_ii(-2), .at_most = times + 1)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(0xfffffffffffffffe);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x75);
  local_740.sentinel_ = 1;
  local_740.never = 0;
  local_740.at_least = 2;
  local_740.at_most = 0;
  local_740.times = 0;
  local_740.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_740);
  if (iVar1 != 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x75
                ,"!mmk_verify(fn_ii(-2), .at_least = times + 1)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(0xfffffffffffffffd);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x76);
  local_718.sentinel_ = 1;
  local_718._4_8_ = 0;
  local_718._12_8_ = 0;
  local_718.at_most._4_4_ = 0;
  local_718.times = 1;
  local_718.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_718);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x76
                ,"mmk_verify(fn_ii(-3), .times = times)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(0xfffffffffffffffd);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x76);
  local_6f0.sentinel_ = 1;
  local_6f0.never = 0;
  local_6f0.at_least = 1;
  local_6f0.at_most = 0;
  local_6f0.times = 0;
  local_6f0.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_6f0);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x76
                ,"mmk_verify(fn_ii(-3), .at_least = times)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(0xfffffffffffffffd);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x76);
  local_6c8.sentinel_ = 1;
  local_6c8.never = 0;
  local_6c8.at_least = 0;
  local_6c8.at_most = 1;
  local_6c8.times = 0;
  local_6c8.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_6c8);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x76
                ,"mmk_verify(fn_ii(-3), .at_most = times)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(0xfffffffffffffffd);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x76);
  local_6a0.sentinel_ = 1;
  local_6a0.never = 0;
  local_6a0.at_least = 1;
  local_6a0.at_most = 1;
  local_6a0.times = 0;
  local_6a0.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_6a0);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x76
                ,"mmk_verify(fn_ii(-3), .at_least = times, .at_most = times)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(0xfffffffffffffffd);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x76);
  local_678.times = 0;
  local_678.matching = (_func_int_size_t *)0x0;
  local_678.at_least = 0;
  local_678.at_most = 0;
  local_678.sentinel_ = 1;
  local_678.never = 1;
  iVar1 = mmk_verify_times(&local_678);
  if (iVar1 != 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x76
                ,"!mmk_verify(fn_ii(-3), .never = 1)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(0xfffffffffffffffd);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x76);
  local_650.sentinel_ = 1;
  local_650._4_8_ = 0;
  local_650._12_8_ = 0;
  local_650.at_most._4_4_ = 0;
  local_650.times = 2;
  local_650.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_650);
  if (iVar1 != 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x76
                ,"!mmk_verify(fn_ii(-3), .times = times + 1)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(0xfffffffffffffffd);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x76);
  local_628.sentinel_ = 1;
  local_628.never = 0;
  local_628.at_least = 0;
  local_628.at_most = 2;
  local_628.times = 0;
  local_628.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_628);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x76
                ,"mmk_verify(fn_ii(-3), .at_most = times + 1)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(0xfffffffffffffffd);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x76);
  local_600.sentinel_ = 1;
  local_600.never = 0;
  local_600.at_least = 2;
  local_600.at_most = 0;
  local_600.times = 0;
  local_600.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_600);
  if (iVar1 != 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x76
                ,"!mmk_verify(fn_ii(-3), .at_least = times + 1)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(0xfffffffffffffffc);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x77);
  local_5d8.sentinel_ = 1;
  local_5d8._4_8_ = 0;
  local_5d8._12_8_ = 0;
  local_5d8.at_most._4_4_ = 0;
  local_5d8.times = 1;
  local_5d8.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_5d8);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x77
                ,"mmk_verify(fn_ii(-4), .times = times)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(0xfffffffffffffffc);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x77);
  local_5b0.sentinel_ = 1;
  local_5b0.never = 0;
  local_5b0.at_least = 1;
  local_5b0.at_most = 0;
  local_5b0.times = 0;
  local_5b0.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_5b0);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x77
                ,"mmk_verify(fn_ii(-4), .at_least = times)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(0xfffffffffffffffc);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x77);
  local_588.sentinel_ = 1;
  local_588.never = 0;
  local_588.at_least = 0;
  local_588.at_most = 1;
  local_588.times = 0;
  local_588.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_588);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x77
                ,"mmk_verify(fn_ii(-4), .at_most = times)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(0xfffffffffffffffc);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x77);
  local_560.sentinel_ = 1;
  local_560.never = 0;
  local_560.at_least = 1;
  local_560.at_most = 1;
  local_560.times = 0;
  local_560.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_560);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x77
                ,"mmk_verify(fn_ii(-4), .at_least = times, .at_most = times)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(0xfffffffffffffffc);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x77);
  local_538.times = 0;
  local_538.matching = (_func_int_size_t *)0x0;
  local_538.at_least = 0;
  local_538.at_most = 0;
  local_538.sentinel_ = 1;
  local_538.never = 1;
  iVar1 = mmk_verify_times(&local_538);
  if (iVar1 != 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x77
                ,"!mmk_verify(fn_ii(-4), .never = 1)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(0xfffffffffffffffc);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x77);
  local_510.sentinel_ = 1;
  local_510._4_8_ = 0;
  local_510._12_8_ = 0;
  local_510.at_most._4_4_ = 0;
  local_510.times = 2;
  local_510.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_510);
  if (iVar1 != 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x77
                ,"!mmk_verify(fn_ii(-4), .times = times + 1)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(0xfffffffffffffffc);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x77);
  local_4e8.sentinel_ = 1;
  local_4e8.never = 0;
  local_4e8.at_least = 0;
  local_4e8.at_most = 2;
  local_4e8.times = 0;
  local_4e8.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_4e8);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x77
                ,"mmk_verify(fn_ii(-4), .at_most = times + 1)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(0xfffffffffffffffc);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x77);
  local_4c0.sentinel_ = 1;
  local_4c0.never = 0;
  local_4c0.at_least = 2;
  local_4c0.at_most = 0;
  local_4c0.times = 0;
  local_4c0.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_4c0);
  if (iVar1 != 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x77
                ,"!mmk_verify(fn_ii(-4), .at_least = times + 1)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(0xfffffffffffffffb);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x78);
  local_498.sentinel_ = 1;
  local_498._4_8_ = 0;
  local_498._12_8_ = 0;
  local_498.at_most._4_4_ = 0;
  local_498.times = 1;
  local_498.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_498);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x78
                ,"mmk_verify(fn_ii(-5), .times = times)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(0xfffffffffffffffb);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x78);
  local_470.sentinel_ = 1;
  local_470.never = 0;
  local_470.at_least = 1;
  local_470.at_most = 0;
  local_470.times = 0;
  local_470.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_470);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x78
                ,"mmk_verify(fn_ii(-5), .at_least = times)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(0xfffffffffffffffb);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x78);
  local_448.sentinel_ = 1;
  local_448.never = 0;
  local_448.at_least = 0;
  local_448.at_most = 1;
  local_448.times = 0;
  local_448.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_448);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x78
                ,"mmk_verify(fn_ii(-5), .at_most = times)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(0xfffffffffffffffb);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x78);
  local_420.sentinel_ = 1;
  local_420.never = 0;
  local_420.at_least = 1;
  local_420.at_most = 1;
  local_420.times = 0;
  local_420.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_420);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x78
                ,"mmk_verify(fn_ii(-5), .at_least = times, .at_most = times)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(0xfffffffffffffffb);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x78);
  local_3f8.times = 0;
  local_3f8.matching = (_func_int_size_t *)0x0;
  local_3f8.at_least = 0;
  local_3f8.at_most = 0;
  local_3f8.sentinel_ = 1;
  local_3f8.never = 1;
  iVar1 = mmk_verify_times(&local_3f8);
  if (iVar1 != 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x78
                ,"!mmk_verify(fn_ii(-5), .never = 1)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(0xfffffffffffffffb);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x78);
  local_3d0.sentinel_ = 1;
  local_3d0._4_8_ = 0;
  local_3d0._12_8_ = 0;
  local_3d0.at_most._4_4_ = 0;
  local_3d0.times = 2;
  local_3d0.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_3d0);
  if (iVar1 != 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x78
                ,"!mmk_verify(fn_ii(-5), .times = times + 1)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(0xfffffffffffffffb);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x78);
  local_3a8.sentinel_ = 1;
  local_3a8.never = 0;
  local_3a8.at_least = 0;
  local_3a8.at_most = 2;
  local_3a8.times = 0;
  local_3a8.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_3a8);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x78
                ,"mmk_verify(fn_ii(-5), .at_most = times + 1)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(0xfffffffffffffffb);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x78);
  local_380.sentinel_ = 1;
  local_380.never = 0;
  local_380.at_least = 2;
  local_380.at_most = 0;
  local_380.times = 0;
  local_380.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_380);
  if (iVar1 != 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x78
                ,"!mmk_verify(fn_ii(-5), .at_least = times + 1)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(0x80000000);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x79);
  local_358.sentinel_ = 1;
  local_358._4_8_ = 0;
  local_358._12_8_ = 0;
  local_358.at_most._4_4_ = 0;
  local_358.times = 1;
  local_358.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_358);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x79
                ,"mmk_verify(fn_ii((-2147483647 -1)), .times = times)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(0x80000000);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x79);
  local_330.sentinel_ = 1;
  local_330.never = 0;
  local_330.at_least = 1;
  local_330.at_most = 0;
  local_330.times = 0;
  local_330.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_330);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x79
                ,"mmk_verify(fn_ii((-2147483647 -1)), .at_least = times)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(0x80000000);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x79);
  local_308.sentinel_ = 1;
  local_308.never = 0;
  local_308.at_least = 0;
  local_308.at_most = 1;
  local_308.times = 0;
  local_308.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_308);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x79
                ,"mmk_verify(fn_ii((-2147483647 -1)), .at_most = times)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(0x80000000);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x79);
  local_2e0.sentinel_ = 1;
  local_2e0.never = 0;
  local_2e0.at_least = 1;
  local_2e0.at_most = 1;
  local_2e0.times = 0;
  local_2e0.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_2e0);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x79
                ,"mmk_verify(fn_ii((-2147483647 -1)), .at_least = times, .at_most = times)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(0x80000000);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x79);
  local_2b8.times = 0;
  local_2b8.matching = (_func_int_size_t *)0x0;
  local_2b8.at_least = 0;
  local_2b8.at_most = 0;
  local_2b8.sentinel_ = 1;
  local_2b8.never = 1;
  iVar1 = mmk_verify_times(&local_2b8);
  if (iVar1 != 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x79
                ,"!mmk_verify(fn_ii((-2147483647 -1)), .never = 1)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(0x80000000);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x79);
  local_290.sentinel_ = 1;
  local_290._4_8_ = 0;
  local_290._12_8_ = 0;
  local_290.at_most._4_4_ = 0;
  local_290.times = 2;
  local_290.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_290);
  if (iVar1 != 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x79
                ,"!mmk_verify(fn_ii((-2147483647 -1)), .times = times + 1)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(0x80000000);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x79);
  local_268.sentinel_ = 1;
  local_268.never = 0;
  local_268.at_least = 0;
  local_268.at_most = 2;
  local_268.times = 0;
  local_268.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_268);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x79
                ,"mmk_verify(fn_ii((-2147483647 -1)), .at_most = times + 1)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(0x80000000);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x79);
  local_240.sentinel_ = 1;
  local_240.never = 0;
  local_240.at_least = 2;
  local_240.at_most = 0;
  local_240.times = 0;
  local_240.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_240);
  if (iVar1 != 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x79
                ,"!mmk_verify(fn_ii((-2147483647 -1)), .at_least = times + 1)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(0xc);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x7a);
  local_218.times = 0;
  local_218.matching = (_func_int_size_t *)0x0;
  local_218.at_least = 0;
  local_218.at_most = 0;
  local_218.sentinel_ = 1;
  local_218.never = 1;
  iVar1 = mmk_verify_times(&local_218);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x7a
                ,"mmk_verify(fn_ii(12), .never = 1)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(0xc);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x7a);
  local_1f0.sentinel_ = 1;
  local_1f0._4_8_ = 0;
  local_1f0._12_8_ = 0;
  local_1f0.at_most._4_4_ = 0;
  local_1f0.times = 1;
  local_1f0.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_1f0);
  if (iVar1 != 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x7a
                ,"!mmk_verify(fn_ii(12), .times = times + 1)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(0xc);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x7a);
  local_1c8.sentinel_ = 1;
  local_1c8.never = 0;
  local_1c8.at_least = 0;
  local_1c8.at_most = 1;
  local_1c8.times = 0;
  local_1c8.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_1c8);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x7a
                ,"mmk_verify(fn_ii(12), .at_most = times + 1)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(0xc);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x7a);
  local_1a0.sentinel_ = 1;
  local_1a0.never = 0;
  local_1a0.at_least = 1;
  local_1a0.at_most = 0;
  local_1a0.times = 0;
  local_1a0.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_1a0);
  if (iVar1 != 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x7a
                ,"!mmk_verify(fn_ii(12), .at_least = times + 1)");
    mmk_abort();
  }
  mmk_reset(fn_ii);
  mmk_mock_create_internal("fn_ii_va",mmkuser_fn_ii_va_mock_stub,(mmk_mock_options)0x1);
  mmk_matcher_init(0);
  local_78.sentinel_ = 0;
  local_78.then_errno = 0;
  local_78.then_call = (_func_void *)0x0;
  local_78.with_va = (mmk_va_info *)0x0;
  local_78.then_return = &local_34;
  local_34 = 1;
  mmk_when_init(&local_78);
  fn_ii_va(1,0x2a);
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x7f);
  mmk_matcher_term();
  iVar1 = fn_ii_va(1,0x2a);
  if (iVar1 != 1) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x81
                ,"fn_ii_va(1, 42) == 1");
    mmk_abort();
  }
  mmk_reset(fn_ii_va);
  return 0;
}

Assistant:

int main(void)
{
    mmk_mock("fn_vv", fn_vv_mock);
    mmk_when(fn_vv(), .then_call = (mmk_fn) set_valid);

    check_called_exact(fn_vv(), 0);
    fn_vv();
    mmk_assert(valid);
    check_called_exact(fn_vv(), 1);
    mmk_reset(fn_vv);

    int err = 0xfefefefe;
    mmk_mock("fn_ii", fn_ii_mock);
    mmk_when(fn_ii(1), .then_return = mmk_val(int, 1), .then_errno = err);
    mmk_when(fn_ii(mmk_eq(int, 2)), .then_return = mmk_val(int, 2), .then_errno = err + 1);
    mmk_when(fn_ii(mmk_ge(int, 3)), .then_return = mmk_val(int, 3), .then_errno = err + 2);
    mmk_when(fn_ii(mmk_gt(int, 4)), .then_return = mmk_val(int, 4), .then_errno = err + 3);
    mmk_when(fn_ii(mmk_le(int, -2)), .then_return = mmk_val(int, 5), .then_errno = err + 4);
    mmk_when(fn_ii(mmk_lt(int, -3)), .then_return = mmk_val(int, 6), .then_errno = err + 5);
    mmk_when(fn_ii(mmk_that(int, int_eq)), .then_return = mmk_val(int, 7), .then_errno = err + 6);

    mmk_assert(fn_ii(1) == 1 && errno == err);
    mmk_assert(fn_ii(2) == 2 && errno == err + 1);
    mmk_assert(fn_ii(3) == 3 && errno == err + 2);
    mmk_assert(fn_ii(4) == 3 && errno == err + 2);
    mmk_assert(fn_ii(5) == 4 && errno == err + 3);
    mmk_assert(fn_ii(6) == 4 && errno == err + 3);
    mmk_assert(fn_ii(INT_MAX)  == 4 && errno == err + 3);
    mmk_assert(fn_ii(-1) == 0);
    mmk_assert(fn_ii(-2) == 5 && errno == err + 4);
    mmk_assert(fn_ii(-3) == 5 && errno == err + 4);
    mmk_assert(fn_ii(-4) == 6 && errno == err + 5);
    mmk_assert(fn_ii(-5) == 6 && errno == err + 5);
    mmk_assert(fn_ii(INT_MIN) == 6 && errno == err + 5);

    expected_int = 1;
    mmk_assert(fn_ii(1) == 7 && errno == err + 6 && int_eq_called);
    int_eq_called = 0;

    check_called_exact(fn_ii(mmk_any(int)), 14);
    check_called_exact(fn_ii(1), 2);
    check_called_exact(fn_ii(2), 1);
    check_called_exact(fn_ii(3), 1);
    check_called_exact(fn_ii(4), 1);
    check_called_exact(fn_ii(5), 1);
    check_called_exact(fn_ii(6), 1);
    check_called_exact(fn_ii(INT_MAX), 1);
    check_called_exact(fn_ii(-1), 1);
    check_called_exact(fn_ii(-2), 1);
    check_called_exact(fn_ii(-3), 1);
    check_called_exact(fn_ii(-4), 1);
    check_called_exact(fn_ii(-5), 1);
    check_called_exact(fn_ii(INT_MIN), 1);
    check_called_exact(fn_ii(12), 0);
    mmk_reset(fn_ii);


    mmk_mock("fn_ii_va", fn_ii_va_mock);
    mmk_when(fn_ii_va(1, 42), .then_return = mmk_val(int, 1));

    mmk_assert(fn_ii_va(1, 42) == 1);

    mmk_reset(fn_ii_va);

    return 0;
}